

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-danger.c
# Opt level: O3

wchar_t borg_danger_one_kill
                  (wchar_t y,wchar_t x,wchar_t c,wchar_t i,_Bool average,_Bool full_damage)

{
  bitflag *flags;
  byte bVar1;
  ushort uVar2;
  wchar_t y_00;
  monster_blow *pmVar3;
  int iVar4;
  short sVar5;
  short sVar6;
  bool bVar7;
  char cVar8;
  char cVar9;
  chunk_conflict *pcVar10;
  monster_race *pmVar11;
  monster_race *pmVar12;
  _Bool _Var13;
  _Bool _Var14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  wchar_t wVar18;
  wchar_t wVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  wchar_t wVar23;
  wchar_t wVar24;
  loc lVar25;
  bool bVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  short sVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  wchar_t wVar48;
  borg_kill *pbVar49;
  borg_kill *pbVar50;
  long lVar51;
  wchar_t x_00;
  ulong uVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  monster_race *r_ptr;
  uint local_114;
  
  pmVar11 = r_info;
  uVar32 = (ulong)borg_kills[i].r_idx;
  if (uVar32 == 0) {
    return L'\0';
  }
  if ((int)(z_info->r_max - 1) <= (int)(uint)borg_kills[i].r_idx) {
    return L'd';
  }
  wVar24 = borg_kills[i].pos.x;
  y_00 = borg_kills[i].pos.y;
  if (0 < borg_tp_other_n) {
    lVar42 = 0;
    do {
      if (borg_tp_other_index[lVar42] == i) {
        return L'\0';
      }
      lVar42 = lVar42 + 1;
    } while ((ulong)(ushort)borg_tp_other_n + 1 != lVar42);
  }
  uVar15 = wVar24 - x;
  uVar28 = -uVar15;
  if (0 < (int)uVar15) {
    uVar28 = uVar15;
  }
  uVar16 = y_00 - y;
  uVar15 = -uVar16;
  if (0 < (int)uVar16) {
    uVar15 = uVar16;
  }
  if (uVar15 < uVar28) {
    uVar15 = uVar28;
  }
  iVar27 = uVar15 + (uVar15 == 0);
  if (0x14 < uVar15) {
    return L'\0';
  }
  iVar17 = (uint)(borg_fighting_unique == L'\0') * 5 + 0x78;
  if (borg.trait[0x2c] < 0x87) {
    iVar17 = borg.trait[0x2c];
  }
  iVar30 = iVar17 + 10;
  if (!borg.temp.fast) {
    iVar30 = iVar17;
  }
  uVar28 = borg_kills[i].speed - 10;
  if (!borg_slow_spell) {
    uVar28 = (uint)borg_kills[i].speed;
  }
  uVar16 = uVar28;
  if ((borg.trait[0x1c] < 0x14) && (uVar16 = uVar28 + 3, borg.trait[0x69] == 0)) {
    uVar16 = uVar28;
  }
  uVar28 = (((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                   [(int)uVar16] *
            (("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
              [iVar30] + 99) /
            (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                  [iVar30])) / 10) * c;
  if (full_damage) {
    uVar28 = ((int)(uVar28 + 9) / 10) * 10;
  }
  pbVar49 = borg_kills + i;
  uVar16 = 10;
  if (10 < (int)uVar28) {
    uVar16 = uVar28;
  }
  sVar33 = (short)borg.trait[0x85] + 0x32;
  if (!borg.temp.shield) {
    sVar33 = (short)borg.trait[0x85];
  }
  bVar53 = true;
  if ((borg.temp.prot_from_evil) &&
     (_Var13 = flag_has_dbg(r_info[uVar32].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL"), _Var13)) {
    bVar53 = borg.trait[0x23] < pmVar11[uVar32].level;
  }
  uVar47 = 1000;
  if ((pbVar49->r_idx != 0) && ((int)(uint)pbVar49->r_idx < (int)(z_info->r_max - 1))) {
    if (z_info->mon_blows_max == 0) {
      uVar47 = 0;
    }
    else {
      iVar17 = (int)sVar33;
      if (0x95 < iVar17) {
        sVar33 = 0x96;
      }
      uVar52 = 0;
      lVar42 = 0x20;
      uVar47 = 0;
      do {
        pmVar3 = pmVar11[uVar32].blow;
        if (*(long *)((long)pmVar3 + lVar42 + -0x18) == 0) break;
        iVar30 = *(int *)((long)pmVar3 + lVar42 + -4);
        iVar44 = *(int *)((long)&pmVar3->next + lVar42);
        wVar18 = borg_mon_blow_effect((char *)**(undefined8 **)((long)pmVar3 + lVar42 + -0x10));
        iVar35 = 0;
        iVar36 = 0;
        switch(wVar18) {
        case L'\x01':
          iVar45 = iVar44 * iVar30;
          uVar46 = uVar47 + 400;
          if (iVar30 < 6) {
            uVar46 = uVar47;
          }
          if (2 < iVar44) {
            uVar46 = uVar47;
          }
          uVar47 = uVar46;
          iVar36 = 0x3c;
          if ((!bVar53) && (borg_attacking == false)) {
            iVar45 = iVar45 / 2;
          }
          break;
        case L'\x02':
          iVar45 = iVar44 * iVar30;
          iVar36 = 5;
          if ((borg.trait[0x49] != 0) || (borg.temp.res_pois != false)) break;
          iVar45 = iVar45 + 10;
LAB_00202861:
          iVar36 = 5;
          if (bVar53) break;
LAB_00202a1e:
          if (borg_attacking != false) break;
          goto LAB_00202bc6;
        case L'\x03':
          iVar45 = iVar44 * iVar30;
          iVar36 = 0x14;
          if (borg.trait[0x54] == 0) {
            iVar45 = iVar45 + 500;
LAB_00202a0e:
            if (!bVar53) goto LAB_00202a1e;
          }
          break;
        case L'\x04':
          iVar45 = iVar44 * iVar30 + 0x14;
          iVar36 = 0xf;
          goto LAB_00202ba6;
        case L'\x05':
          iVar45 = iVar44 * iVar30 + 0x32;
          if (4 < borg.trait[0x23]) {
            iVar45 = iVar44 * iVar30;
          }
          iVar36 = 5;
          if ((borg.trait[0x23] + adj_dex_safe[borg.trait[0x12]] < 100) &&
             (0xfffe79c2 < borg.trait[0x2d] - 0x186a1U)) {
LAB_00202827:
            iVar45 = iVar45 + 5;
            goto LAB_00202861;
          }
          break;
        case L'\x06':
          iVar45 = iVar44 * iVar30;
          iVar36 = 5;
          if (borg.trait[0x23] + adj_dex_safe[borg.trait[0x12]] < 100) {
LAB_00202a0a:
            iVar36 = 5;
            iVar45 = iVar44 * iVar30 + 5;
            goto LAB_00202a0e;
          }
          break;
        case L'\a':
          iVar45 = iVar44 * iVar30;
          iVar36 = 5;
          if (borg.trait[0x27] < 6) goto LAB_00202a0a;
          break;
        case L'\b':
          iVar45 = iVar44 * iVar30;
          iVar36 = 5;
          if (((borg_items[(ulong)z_info->pack_size + 5].timeout != 0) &&
              (_Var13 = flag_has_dbg(borg_items[(ulong)z_info->pack_size + 5].flags,5,0x15,
                                     "borg_items[INVEN_LIGHT].flags","OF_NO_FUEL"), !_Var13)) &&
             (borg.trait[0xd5] < 6)) goto LAB_00202827;
          break;
        case L'\t':
          if (borg.trait[0x41] != 0) goto switchD_00202400_default;
          iVar44 = iVar44 * iVar30;
          if (borg.trait[0x48] != 0) {
            iVar44 = (iVar44 + 2) / 3;
          }
          if (borg.temp.res_acid == true) {
            iVar44 = (iVar44 + 2) / 3;
          }
          iVar45 = iVar44 + 200;
          if (bVar53) break;
joined_r0x00202ab4:
          iVar36 = 0;
          if (borg_attacking == false) {
            iVar36 = 0;
            iVar45 = iVar45 / 2;
          }
          break;
        case L'\n':
          if (borg.trait[0x43] != 0) goto switchD_00202400_default;
          iVar44 = iVar44 * iVar30;
          if (borg.trait[0x47] != 0) {
            iVar44 = (iVar44 + 2) / 3;
          }
          bVar56 = borg.temp.res_elec == true;
LAB_00202b0b:
          if (bVar56) {
            iVar44 = (iVar44 + 2) / 3;
          }
joined_r0x00202517:
          iVar36 = 10;
          iVar45 = iVar44 * 2;
          if ((!bVar53) && (iVar36 = 10, iVar45 = iVar44, borg_attacking != false)) {
            iVar45 = iVar44 * 2;
          }
          break;
        case L'\v':
          if (borg.trait[0x40] == 0) {
            iVar44 = iVar44 * iVar30;
            if (borg.trait[0x45] != 0) {
              iVar44 = (iVar44 + 2) / 3;
            }
            bVar56 = borg.temp.res_fire == true;
            goto LAB_00202b0b;
          }
        default:
switchD_00202400_default:
          iVar45 = 0;
          iVar36 = iVar35;
          break;
        case L'\f':
          if (borg.trait[0x42] == 0) {
            iVar44 = iVar44 * iVar30;
            if (borg.trait[0x46] != 0) {
              iVar44 = (iVar44 + 2) / 3;
            }
            bVar56 = borg.temp.res_acid == true;
            goto LAB_00202b0b;
          }
          goto switchD_00202400_default;
        case L'\r':
          iVar45 = iVar44 * iVar30;
          iVar36 = 2;
          if (borg.trait[0x4d] == 0) {
            iVar30 = iVar45 + 10;
            iVar45 = iVar45 + 0x55;
LAB_002029df:
            if (borg.trait[0x19] != 1) {
              iVar45 = iVar30;
            }
            goto LAB_00202a0e;
          }
          break;
        case L'\x0e':
          iVar45 = iVar44 * iVar30;
          iVar36 = 10;
          if (borg.trait[0x4e] == 0) {
            iVar30 = iVar45 + 200;
            iVar45 = iVar45 + 400;
            goto LAB_002029df;
          }
          break;
        case L'\x0f':
          iVar45 = iVar44 * iVar30;
          iVar36 = 10;
          iVar44 = iVar45;
          if (borg.trait[0x4a] == 0) goto joined_r0x00202517;
          break;
        case L'\x10':
          iVar45 = iVar44 * iVar30;
          iVar36 = 2;
          if (borg.trait[0x56] == 0) {
            iVar45 = iVar45 + 200;
            goto LAB_00202a0e;
          }
          break;
        case L'\x11':
          iVar45 = iVar44 * iVar30;
          if ((((borg.trait[0x14] == 0) && (3 < borg.trait[10])) &&
              (_Var13 = borg_spell_legal(RESTORATION), iVar36 = iVar35, !_Var13)) &&
             ((_Var13 = borg_spell_legal(REVITALIZE), !_Var13 &&
              (_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13)))) {
            iVar30 = iVar45 + 0x96;
            iVar45 = iVar45 + 0xfa;
            bVar57 = SBORROW4(borg.trait[10],10);
            bVar56 = borg.trait[10] + -10 < 0;
LAB_00202c42:
            if (bVar57 == bVar56) {
              iVar45 = iVar30;
            }
            goto joined_r0x00202445;
          }
          break;
        case L'\x12':
          iVar45 = iVar44 * iVar30;
          if (((borg.trait[0x15] == 0) && (3 < borg.trait[0xb])) &&
             ((_Var13 = borg_spell_legal(RESTORATION), iVar36 = iVar35, !_Var13 &&
              ((_Var13 = borg_spell_legal(REVITALIZE), !_Var13 &&
               (_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13)))))) {
            wVar18 = borg_spell_stat();
            bVar56 = wVar18 == L'\x01';
LAB_00202a98:
            iVar45 = iVar44 * iVar30 + 200;
            if (!bVar56) {
              iVar45 = iVar44 * iVar30 + 0x96;
            }
            goto joined_r0x00202445;
          }
          break;
        case L'\x13':
          iVar45 = iVar44 * iVar30;
          if ((((borg.trait[0x16] == 0) && (3 < borg.trait[0xc])) &&
              (_Var13 = borg_spell_legal(RESTORATION), iVar36 = iVar35, !_Var13)) &&
             (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)) {
            wVar18 = borg_spell_stat();
            bVar56 = wVar18 == L'\x02';
            goto LAB_00202a98;
          }
          break;
        case L'\x14':
          iVar45 = iVar44 * iVar30;
          if (((borg.trait[0x17] == 0) && (3 < borg.trait[0xd])) &&
             ((_Var13 = borg_spell_legal(RESTORATION), iVar36 = iVar35, !_Var13 &&
              (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)))) {
            iVar30 = iVar45 + 0x96;
            iVar45 = iVar45 + 0xfa;
            bVar57 = SBORROW4(borg.trait[0xd],10);
            bVar56 = borg.trait[0xd] + -10 < 0;
            goto LAB_00202c42;
          }
          break;
        case L'\x15':
          iVar45 = iVar44 * iVar30;
          if ((((borg.trait[0x18] == 0) && (3 < borg.trait[0xe])) &&
              (_Var13 = borg_spell_legal(RESTORATION), iVar36 = iVar35, !_Var13)) &&
             ((_Var13 = borg_spell_legal(REVITALIZE), !_Var13 &&
              (_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13)))) {
            iVar30 = iVar45 + 0x96;
            iVar45 = iVar45 + 0xfa;
            bVar57 = SBORROW4(borg.trait[10],8);
            bVar56 = borg.trait[10] + -8 < 0;
            goto LAB_00202c42;
          }
          break;
        case L'\x16':
          iVar45 = iVar44 * iVar30;
          iVar36 = 2;
          break;
        case L'\x17':
          iVar36 = (int)((ulong)((long)(iVar44 * iVar30 * (int)sVar33) * -0x10624dd3) >> 0x20);
          iVar45 = iVar44 * iVar30 + ((iVar36 >> 4) - (iVar36 >> 0x1f)) + 0x96;
          iVar36 = 0x3c;
LAB_00202ba6:
          if ((!bVar53) && (borg_attacking == false)) {
LAB_00202bc6:
            iVar45 = iVar45 / 2;
          }
          break;
        case L'\x18':
          iVar45 = iVar44 * iVar30;
          if (((borg.trait[0x55] == 0) && (borg.trait[0x23] != 0x32)) &&
             ((_Var13 = borg_spell_legal(REMEMBRANCE), iVar36 = iVar35, !_Var13 &&
              ((_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13 &&
               (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)))))) {
            iVar45 = iVar45 + 100;
            goto joined_r0x00202445;
          }
          break;
        case L'\x19':
          iVar45 = iVar44 * iVar30;
          if ((((borg.trait[0x55] == 0) && (borg.trait[0x23] < 0x32)) &&
              (_Var13 = borg_spell_legal(REMEMBRANCE), iVar36 = iVar35, !_Var13)) &&
             ((_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13 &&
              (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)))) {
            iVar45 = iVar45 + 0x96;
            goto joined_r0x00202445;
          }
          break;
        case L'\x1a':
          iVar45 = iVar44 * iVar30;
          if (((borg.trait[0x55] == 0) && (borg.trait[0x23] < 0x32)) &&
             ((_Var13 = borg_spell_legal(REMEMBRANCE), iVar36 = iVar35, !_Var13 &&
              ((_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13 &&
               (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)))))) {
            iVar45 = iVar45 + 200;
            goto joined_r0x00202445;
          }
          break;
        case L'\x1b':
          iVar45 = iVar44 * iVar30;
          if ((((borg.trait[0x55] == 0) && (iVar36 = iVar35, borg.trait[0x23] < 0x32)) &&
              (_Var13 = borg_spell_legal(REMEMBRANCE), !_Var13)) &&
             ((_Var13 = borg_spell_legal(UNHOLY_REPRIEVE), !_Var13 &&
              (_Var13 = borg_spell_legal(REVITALIZE), !_Var13)))) {
            iVar45 = iVar45 + 0xfa;
            goto joined_r0x00202445;
          }
          break;
        case L'\x1c':
          iVar45 = iVar44 * iVar30 + 0xfa;
joined_r0x00202445:
          iVar36 = 0;
          if (!bVar53) goto joined_r0x00202ab4;
        }
        uVar46 = iVar45 - borg.trait[0x2f];
        if ((int)uVar46 < 1) {
          uVar46 = 0;
        }
        if (!full_damage) {
          iVar36 = iVar36 + pmVar11[uVar32].level;
          iVar30 = iVar17 * -0x4b + 0x96 + iVar36 * -3;
          if (iVar30 < 6) {
            iVar30 = 5;
          }
          iVar44 = 5;
          if (0 < iVar36) {
            iVar44 = iVar30;
          }
          if (borg_fighting_unique != L'\0') {
            iVar44 = iVar30;
          }
          uVar46 = (iVar44 * uVar46) / 100;
        }
        uVar47 = uVar46 + uVar47;
        uVar52 = uVar52 + 1;
        lVar42 = lVar42 + 0x30;
      } while (uVar52 < z_info->mon_blows_max);
    }
  }
  uVar46 = uVar47;
  if (25000 < borg_t) {
    uVar46 = (int)uVar47 / 5;
  }
  if (0x4b0 < borg.time_this_panel) {
    uVar46 = (int)uVar47 / 5;
  }
  flags = pmVar11[uVar32].flags;
  _Var13 = flag_has_dbg(flags,0xb,0x14,"r_ptr->flags","RF_NEVER_BLOW");
  _Var14 = flag_has_dbg(flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
  if (_Var13) {
    uVar46 = 0;
  }
  uVar52 = 0;
  if (!_Var14) {
    uVar52 = (ulong)uVar46;
  }
  if (uVar15 < 2) {
    uVar52 = (ulong)uVar46;
  }
  _Var13 = flag_has_dbg(flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
  if ((_Var13) && (borg.trait[0x23] < 0x14)) {
    uVar52 = (ulong)(uint)(((int)uVar52 * 0xf) / 10 + (int)uVar52);
  }
  if (((pmVar11[uVar32].friends != (monster_friends *)0x0) ||
      (pmVar11[uVar32].friends_base != (monster_friends_base *)0x0)) && (borg.trait[0x23] < 0x14)) {
    iVar17 = (int)uVar52;
    if (borg.trait[0x23] < 0xf) {
      iVar30 = iVar17 * 0x12;
    }
    else {
      iVar30 = iVar17 * 0xd;
    }
    uVar52 = (ulong)(uint)(iVar30 / 10 + iVar17);
  }
  wVar18 = (wchar_t)uVar52;
  if (pbVar49->awake == true) {
    bVar53 = uVar15 < 2;
    if (!bVar53) goto LAB_002030df;
    if (borg_sleep_spell_ii != false) {
      _Var13 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP");
      bVar53 = true;
      if (((!_Var13) && (_Var13 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13)) &&
         ((int)pbVar49->level <= borg.trait[0x23] + -0xf)) {
        if ((borg.trait[0x23] < 0x14) && (borg.trait[0x1b] < borg.trait[0x1c] / 2)) {
          wVar18 = L'\0';
        }
        else {
          wVar18 = wVar18 / 3;
        }
      }
    }
  }
  else {
    wVar23 = (int)(uVar52 >> 0x1f) + wVar18 >> 1;
    if (borg.trait[0x23] < 0x19) {
      wVar23 = wVar18;
    }
    wVar18 = ((pmVar11[uVar32].sleep + L'\x05') * wVar23) / 100 + wVar23;
LAB_002030df:
    bVar53 = uVar15 < 2;
  }
  wVar23 = wVar18;
  if (((((borg_sleep_spell == true) && (pbVar49->awake == true)) &&
       (_Var13 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var13)) &&
      ((_Var13 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13 &&
       ((int)pbVar49->level <= borg.trait[0x23] + -0xf)))) &&
     ((0x13 < borg.trait[0x23] || (wVar23 = L'\0', borg.trait[0x1c] / 2 <= borg.trait[0x1b])))) {
    wVar23 = wVar18 / (iVar27 + 2);
  }
  if ((borg_crush_spell == true) &&
     (((int)pbVar49->injury * (int)pbVar49->power) / 100 < borg.trait[0x23] * 4)) {
    wVar23 = L'\0';
  }
  wVar18 = wVar23 / 2;
  if (pbVar49->confused == false) {
    wVar18 = wVar23;
  }
  if (pbVar49->stunned == true) {
    wVar18 = (wVar18 * 10) / 0xd;
  }
  wVar23 = wVar18;
  if ((((borg_confuse_spell == true) && (((~pbVar49->awake | pbVar49->confused) & 1U) == 0)) &&
      (_Var13 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var13)) &&
     (((_Var13 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13 &&
       ((int)pbVar49->level <= borg.trait[0x23] + -0xf)) &&
      ((0x13 < borg.trait[0x23] || (wVar23 = L'\0', borg.trait[0x1c] / 2 <= borg.trait[0x1b])))))) {
    wVar23 = wVar18 / (iVar27 + 2);
  }
  wVar18 = L'\0';
  if (borg_fear_mon_spell == false) {
    wVar18 = wVar23;
  }
  wVar23 = wVar18;
  if ((10 < (int)uVar28 && bVar53 == false) &&
     (_Var13 = flag_has_dbg(flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"), !_Var13)) {
    lVar42 = 0;
    wVar23 = L'\0';
    do {
      pcVar10 = cave;
      lVar37 = (long)ddy_ddd[lVar42] + (long)y_00;
      lVar51 = (long)ddx_ddd[lVar42] + (long)wVar24;
      x_00 = (wchar_t)lVar51;
      wVar48 = (wchar_t)lVar37;
      lVar25 = (loc)loc(x_00,wVar48);
      _Var13 = square_in_bounds_fully(pcVar10,lVar25);
      if ((_Var13) && (borg_grids[lVar37][lVar51].kill == '\0')) {
        bVar1 = borg_grids[lVar37][lVar51].feat;
        if (bVar1 - 0x10 < 6) {
          _Var13 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
          if ((_Var13) && (wVar19 = borg_distance(wVar48,x_00,y,x), wVar19 == L'\x01')) {
            wVar23 = wVar18;
          }
          _Var13 = flag_has_dbg(flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
          if ((_Var13) && (wVar19 = borg_distance(wVar48,x_00,y,x), wVar19 == L'\x01')) {
            wVar23 = wVar18;
          }
        }
        else if ((bVar1 == 2) || (bVar1 == 0x16)) goto LAB_002033f7;
        wVar19 = borg_distance(wVar48,x_00,y,x);
        if ((wVar19 < L'\x02') && (_Var13 = borg_cave_floor_bold(wVar48,x_00), _Var13)) {
          wVar23 = (uVar16 / (uint)(iVar27 * 10)) * wVar18;
        }
      }
LAB_002033f7:
      lVar42 = lVar42 + 1;
    } while (lVar42 != 8);
  }
  pbVar50 = borg_kills;
  pmVar12 = r_info;
  if ((10 < (int)uVar28 & bVar53) == 1) {
    wVar23 = (wVar23 * uVar28) / 10;
  }
  bVar56 = false;
  wVar18 = wVar23;
  if ((int)uVar28 < 0xb) {
    wVar18 = L'\0';
  }
  if (uVar15 < 2) {
    wVar18 = wVar23;
  }
  uVar2 = borg_kills[i].r_idx;
  bVar57 = true;
  if (borg.temp.prot_from_evil == true) {
    _Var13 = flag_has_dbg(r_info[uVar2].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
    if (_Var13) {
      bVar57 = borg.trait[0x23] < pmVar12[uVar2].level;
      bVar56 = pmVar12[uVar2].level <= borg.trait[0x23];
    }
    else {
      bVar56 = false;
    }
  }
  pbVar50 = pbVar50 + i;
  bVar7 = true;
  if (borg_on_glyph == false) {
    if ((long)track_glyph.num < 1) {
      bVar7 = false;
    }
    else {
      lVar42 = 0;
      bVar7 = false;
      do {
        if ((track_glyph.y[lVar42] == y) && (track_glyph.x[lVar42] == x)) {
          bVar7 = true;
        }
        lVar42 = lVar42 + 1;
      } while (track_glyph.num != lVar42);
    }
  }
  uVar47 = 1000;
  if ((pbVar50->r_idx != 0) && ((int)(uint)pbVar50->r_idx < (int)(z_info->r_max - 1))) {
    if (pbVar50->ranged_attack == '\0') {
      uVar47 = 0;
    }
    else {
      iVar30 = (int)(pbVar50->power / 3);
      iVar17 = 0x640;
      if (iVar30 < 0x640) {
        iVar17 = iVar30;
      }
      iVar36 = (int)(pbVar50->power / 6);
      iVar44 = 200;
      if (iVar36 < 200) {
        iVar44 = iVar36;
      }
      iVar35 = 0x96;
      if (iVar36 < 0x96) {
        iVar35 = iVar36;
      }
      iVar45 = 500;
      if (iVar36 < 500) {
        iVar45 = iVar36;
      }
      sVar33 = (short)iVar45 * 6;
      sVar5 = sVar33 / 9;
      iVar4 = 200;
      if (iVar30 < 200) {
        iVar4 = iVar30;
      }
      iVar39 = 0x96;
      if (iVar30 < 0x96) {
        iVar39 = iVar30;
      }
      iVar31 = 400;
      if (iVar36 < 400) {
        iVar31 = iVar36;
      }
      sVar33 = sVar33 / 10;
      iVar40 = 600;
      if (iVar36 < 600) {
        iVar40 = iVar36;
      }
      iVar36 = 800;
      if (iVar30 < 800) {
        iVar36 = iVar30;
      }
      iVar41 = 100;
      iVar30 = 0;
      if (uVar15 < 4) {
        iVar30 = iVar41;
      }
      if (2 < uVar15) {
        iVar41 = 0;
      }
      iVar20 = (int)((short)((short)iVar17 + 2) / 3);
      iVar43 = 1;
      uVar52 = 0;
      bVar26 = false;
      iVar38 = 0;
      uVar15 = 0;
      do {
        iVar34 = iVar20;
        cVar8 = borg.temp.res_elec;
        cVar9 = borg.temp.res_cold;
        switch(pbVar50->spell[uVar52]) {
        case '\x01':
        case 'H':
          iVar22 = 5;
          goto LAB_00204f61;
        case '\x02':
          iVar22 = 0;
          iVar34 = iVar41;
          break;
        case '\x03':
          iVar22 = 0;
          iVar34 = iVar30;
          break;
        case '\x04':
          wVar23 = pmVar12[uVar2].spell_power;
          wVar48 = wVar23 + L'\a';
          if (L'\xffffffff' < wVar23) {
            wVar48 = wVar23;
          }
          iVar34 = (wVar48 >> 3) * 5 + 5;
          goto LAB_0020525b;
        case '\x05':
          wVar23 = pmVar12[uVar2].spell_power;
          wVar48 = wVar23 + L'\a';
          if (L'\xffffffff' < wVar23) {
            wVar48 = wVar23;
          }
          iVar34 = (wVar48 >> 3) * 6 + 6;
          goto LAB_0020525b;
        case '\x06':
          wVar23 = pmVar12[uVar2].spell_power;
          wVar48 = wVar23 + L'\a';
          if (L'\xffffffff' < wVar23) {
            wVar48 = wVar23;
          }
          iVar34 = ((wVar48 & 0xfffffff8U) - (wVar48 >> 3)) + 7;
          goto LAB_0020525b;
        case '\a':
          if (borg.trait[0x41] != 0) goto switchD_00203845_caseD_1b;
          if (borg.trait[0x48] == 0) {
            iVar34 = iVar17;
          }
          iVar29 = 0x28;
          iVar22 = 0x28;
          cVar9 = borg.temp.res_acid;
joined_r0x00205403:
          if (cVar9 == '\x01') goto LAB_00205461;
          break;
        case '\b':
          if (borg.trait[0x43] == 0) {
            if (borg.trait[0x47] == 0) {
              iVar34 = iVar17;
            }
            iVar29 = 0x14;
            iVar22 = 0x14;
            cVar9 = borg.temp.res_elec;
            goto joined_r0x00205403;
          }
          goto switchD_00203845_caseD_1b;
        case '\t':
          if (borg.trait[0x40] == 0) {
            if (borg.trait[0x45] == 0) {
              iVar34 = iVar17;
            }
            iVar29 = 0x28;
            iVar22 = 0x28;
            cVar9 = borg.temp.res_fire;
            goto joined_r0x00205403;
          }
          goto switchD_00203845_caseD_1b;
        case '\n':
          if (borg.trait[0x42] == 0) {
            if (borg.trait[0x46] == 0) {
              iVar34 = iVar17;
            }
            iVar29 = 0x14;
            iVar22 = 0x14;
            goto joined_r0x00205403;
          }
          goto switchD_00203845_caseD_1b;
        case '\v':
          iVar22 = borg.trait[0x49];
          iVar34 = (int)((short)((short)iVar36 + 2) / 3);
          if (iVar22 == 0) {
            iVar34 = iVar36;
          }
          goto LAB_0020523b;
        case '\f':
          bVar54 = borg.trait[0x52] == 0;
          iVar22 = 0x7d;
          if (!bVar54) {
            iVar22 = 0;
          }
          goto LAB_00204b28;
        case '\r':
          if (borg.trait[0x4b] != 0) goto LAB_00204186;
LAB_00204688:
          if (borg.trait[0x4d] == 0) {
            iVar22 = 0x14;
            iVar34 = iVar45;
            if (borg.trait[0x19] == 1) {
              iVar22 = 0x28;
            }
          }
          else {
            iVar22 = 0;
            iVar34 = iVar45;
          }
          break;
        case '\x0e':
          if (borg.trait[0x4c] == 0) goto LAB_00204688;
LAB_00204186:
          iVar22 = 0;
          iVar34 = (iVar45 * 2) / 3;
          break;
        case '\x0f':
          if (borg.trait[0x4f] == 0) {
            iVar22 = iVar45 + 500;
            if (borg.trait[0x75] == 0) {
              iVar22 = iVar45;
            }
            iVar29 = borg.trait[0x76];
            iVar34 = iVar22 + 1000;
LAB_002052b9:
            if (iVar29 == 0) {
              iVar34 = iVar22;
            }
            goto LAB_002052bc;
          }
          iVar22 = 0;
          iVar34 = (int)((short)((short)iVar45 * 5) / 9);
          break;
        case '\x10':
          bVar54 = borg.trait[0x53] == 0;
          iVar22 = 100;
          if (bVar54) {
            iVar22 = 300;
          }
LAB_00204b28:
          iVar34 = (int)((short)((short)iVar40 * 6) / 9);
          if (bVar54) {
            iVar34 = iVar40;
          }
          break;
        case '\x11':
          bVar54 = borg.trait[0x54] == 0;
          iVar22 = 500;
          sVar6 = sVar33;
          if (!bVar54) {
            iVar22 = 0;
          }
          goto LAB_00204a92;
        case '\x12':
          iVar22 = 100;
          iVar34 = iVar31;
          if (borg.trait[0x51] != 0) {
            iVar22 = 0;
            iVar34 = (int)((short)((short)iVar31 * 6) / 10);
          }
          break;
        case '\x13':
          iVar22 = 0xfa;
          iVar34 = iVar39;
          break;
        case '\x14':
          iVar22 = 100;
          iVar34 = iVar44;
          break;
        case '\x15':
          iVar22 = 100;
          iVar34 = iVar4;
          if (borg.trait[0x4f] == 0) {
            iVar29 = iVar4 + 500;
            if (borg.trait[0x75] == 0) {
              iVar29 = iVar4;
            }
            iVar22 = 100;
            iVar34 = iVar29 + 1000;
            if (borg.trait[0x76] == 0) {
              iVar34 = iVar29;
            }
          }
          break;
        case '\x16':
          bVar54 = borg.trait[0x50] == 0;
          iVar22 = 0x32;
          sVar6 = sVar5;
          if (!bVar54) {
            iVar22 = 0;
          }
LAB_00204a92:
          iVar34 = (int)sVar6;
          if (bVar54) {
            iVar34 = iVar45;
          }
          break;
        case '\x17':
          if (borg.trait[0x4f] == 0) {
            iVar22 = iVar35 + 500;
            if (borg.trait[0x75] == 0) {
              iVar22 = iVar35;
            }
            iVar34 = iVar22 + 1000;
            if (borg.trait[0x76] == 0) {
              iVar34 = iVar22;
            }
            iVar22 = 100;
          }
          else {
            iVar22 = 0;
            iVar34 = iVar35;
          }
          break;
        case '\x18':
          if (borg.trait[0x4f] == 0) {
            iVar22 = iVar44 + 100;
            if (borg.trait[0x75] == 0) {
              iVar22 = iVar44;
            }
            iVar29 = borg.trait[0x76];
            iVar34 = iVar22 + 500;
            goto LAB_002052b9;
          }
          iVar22 = 0;
          iVar34 = iVar44;
          break;
        case '\x19':
          iVar22 = 0;
          iVar34 = iVar17;
          break;
        case '\x1a':
          iVar34 = ((uint)((ulong)((long)pmVar12[uVar2].spell_power * 0x92492493) >> 0x22) -
                   (pmVar12[uVar2].spell_power >> 0x1f)) * 0xc + 0xc;
          goto LAB_00204c77;
        default:
          goto switchD_00203845_caseD_1b;
        case '\x1c':
          if (borg.trait[0x41] == 0) {
            if (borg.trait[0x48] == 0) {
              iVar34 = pmVar12[uVar2].spell_power * 3 + 0xf;
            }
            else {
              iVar34 = (pmVar12[uVar2].spell_power * 3 + 0x11) / 3;
            }
            iVar29 = 0x28;
            iVar22 = 0x28;
            cVar9 = borg.temp.res_acid;
            goto joined_r0x00205403;
          }
          goto switchD_00203845_caseD_1b;
        case '\x1d':
          if (borg.trait[0x43] != 0) goto switchD_00203845_caseD_1b;
          iVar34 = (pmVar12[uVar2].spell_power * 3) / 2;
          if (borg.trait[0x47] == 0) {
            iVar34 = iVar34 + 8;
          }
          else {
            iVar34 = (iVar34 + 10) / 3;
          }
          iVar29 = 0x14;
          iVar22 = 0x14;
joined_r0x002053ba:
          if (cVar8 != '\x01') break;
LAB_00205461:
          iVar22 = iVar29;
          iVar34 = (iVar34 + 2) / 3;
          break;
        case '\x1e':
          if (borg.trait[0x40] == 0) {
            iVar34 = (pmVar12[uVar2].spell_power * 7) / 2;
            if (borg.trait[0x45] == 0) {
              iVar34 = iVar34 + 10;
            }
            else {
              iVar34 = (iVar34 + 0xc) / 3;
            }
            iVar29 = 0x28;
            iVar22 = 0x28;
            cVar8 = borg.temp.res_fire;
            goto joined_r0x002053ba;
          }
          goto switchD_00203845_caseD_1b;
        case '\x1f':
          if (borg.trait[0x42] == 0) {
            iVar34 = (pmVar12[uVar2].spell_power * 3) / 2;
            if (borg.trait[0x46] == 0) {
              iVar34 = iVar34 + 10;
            }
            else {
              iVar34 = (iVar34 + 0xc) / 3;
            }
            iVar29 = 0x14;
            iVar22 = 0x14;
            goto joined_r0x00205403;
          }
          goto switchD_00203845_caseD_1b;
        case ' ':
          uVar47 = (pmVar12[uVar2].spell_power - (pmVar12[uVar2].spell_power >> 0x1f)) * 2 &
                   0xfffffffc;
          iVar22 = borg.trait[0x49];
          if (iVar22 == 0) {
            iVar34 = uVar47 + 0xc;
          }
          else {
            iVar34 = (int)(uVar47 + 0xe) / 3;
          }
LAB_0020523b:
          if (borg.temp.res_pois == true) {
            uVar47 = iVar34 + 2;
            uVar46 = uVar47 >> 0x1f;
            iVar34 = (int)uVar47 / 3 + ((int)uVar47 >> 0x1f);
LAB_00205259:
            iVar34 = iVar34 + uVar46;
            goto LAB_0020525b;
          }
          iVar29 = 0;
          bVar54 = iVar22 == 0;
          iVar22 = 0x14;
LAB_0020526b:
          if (!bVar54) {
            iVar22 = iVar29;
          }
          break;
        case '!':
          iVar34 = (pmVar12[uVar2].spell_power * 3) / 2 + 10;
          if (borg.trait[0x50] != 0) goto LAB_00204d09;
          iVar22 = 0x14;
          break;
        case '\"':
          iVar34 = (pmVar12[uVar2].spell_power * 8 + 200) * 3 >> 3;
          if (borg.trait[0x52] == 0) {
            iVar34 = pmVar12[uVar2].spell_power * 4 + 100;
          }
          iVar22 = 0xfa;
          if (borg.trait[0x52] != 0) {
            iVar22 = 0;
          }
          break;
        case '#':
          iVar34 = (pmVar12[uVar2].spell_power * 5) / 2 + 0x32;
          if (borg.trait[0x4f] != 0) goto LAB_0020525b;
          iVar29 = 500;
          if (borg.trait[0x75] == 0) {
            iVar29 = 0;
          }
          iVar22 = iVar29 + 1000;
          if (borg.trait[0x76] == 0) {
            iVar22 = iVar29;
          }
          if (borg.trait[0x4e] != 0) break;
          iVar29 = iVar22 + 0x32;
          iVar22 = iVar22 + 0x46;
          bVar54 = borg.trait[0x19] == 1;
          goto LAB_0020526b;
        case '$':
          iVar34 = pmVar12[uVar2].spell_power * 5 + 100;
          goto LAB_002052bc;
        case '%':
          iVar34 = (pmVar12[uVar2].spell_power * 3) / 2;
          iVar34 = ((iVar34 - (iVar34 + 1 >> 0x1f)) + 1 >> 1) + 10;
LAB_002052bc:
          iVar22 = 0x32;
          break;
        case '&':
          iVar34 = pmVar12[uVar2].spell_power * 4 + 100;
          if (borg.trait[0x4c] != 0) goto LAB_00204d09;
LAB_0020482f:
          if (borg.trait[0x4d] != 0) goto LAB_0020525b;
          iVar22 = 0x14;
          if (borg.trait[0x19] == 1) {
            iVar22 = 0x28;
          }
          break;
        case '\'':
          iVar34 = (pmVar12[uVar2].spell_power * 3) / 2 + 10;
          if (borg.trait[0x4b] == 0) goto LAB_0020482f;
LAB_00204d09:
          uVar47 = iVar34 * 6 >> 0x1f;
          uVar46 = uVar47 >> 0x1f;
          iVar34 = (iVar34 * 6) / 9 + uVar47;
          goto LAB_00205259;
        case '(':
          iVar34 = pmVar12[uVar2].spell_power * 5 + 0x46;
          if (borg.trait[0x4f] != 0) goto LAB_0020525b;
          iVar29 = 500;
          if (borg.trait[0x75] == 0) {
            iVar29 = 0;
          }
          iVar22 = iVar29 + 1000;
          if (borg.trait[0x76] == 0) {
            iVar22 = iVar29;
          }
          break;
        case ')':
          iVar22 = 100;
          if (borg.trait[0x1f] == 0) {
            iVar22 = 0;
          }
          goto LAB_00204f61;
        case '*':
          if (99 < borg.trait[0x39]) goto switchD_00203845_caseD_1b;
          iVar34 = pmVar12[uVar2].spell_power / 2 + 1;
LAB_0020525b:
          iVar22 = 0;
          break;
        case '+':
          iVar34 = borg.trait[0x39] * -2 + 200;
          iVar22 = 0;
          if (0 < iVar34) {
            iVar22 = iVar34;
          }
          iVar34 = 0x60;
          break;
        case ',':
          if (borg.trait[0x39] < 100) {
            iVar34 = (0x78 - borg.trait[0x39]) * (pmVar12[uVar2].spell_power / 3) * 10;
            uVar47 = iVar34 >> 0x1f;
            uVar46 = uVar47 >> 0x1f;
            iVar34 = iVar34 / 100 + uVar47;
            goto LAB_00205259;
          }
          goto switchD_00203845_caseD_1b;
        case '-':
          if (borg.trait[0x41] != 0) {
            iVar34 = 0;
            goto LAB_00204c77;
          }
          iVar34 = pmVar12[uVar2].spell_power >> 0x1f;
          iVar22 = pmVar12[uVar2].spell_power / 3 + iVar34;
          if (borg.trait[0x48] == 0) {
            iVar34 = (iVar22 - iVar34) + 0x38;
          }
          else {
            iVar34 = ((iVar22 - iVar34) + 0x3a) / 3;
          }
          iVar29 = 0x28;
          iVar22 = 0x28;
          if (borg.temp.res_acid != true) goto LAB_00204f6a;
LAB_0020549c:
          iVar22 = iVar29;
          iVar34 = (iVar34 + 2) / 3;
          goto LAB_00204f6a;
        case '.':
          if (borg.trait[0x43] != 0) goto switchD_00203845_caseD_1b;
          iVar34 = pmVar12[uVar2].spell_power >> 0x1f;
          iVar22 = pmVar12[uVar2].spell_power / 3 + iVar34;
          if (borg.trait[0x47] == 0) {
            iVar34 = (iVar22 - iVar34) + 0x20;
          }
          else {
            iVar34 = ((iVar22 - iVar34) + 0x22) / 3;
          }
          iVar29 = 0x14;
joined_r0x002053e5:
          iVar22 = iVar29;
          if (cVar8 == '\x01') goto LAB_0020549c;
          goto LAB_00204f6a;
        case '/':
          if (borg.trait[0x40] == 0) {
            iVar34 = pmVar12[uVar2].spell_power >> 0x1f;
            iVar22 = pmVar12[uVar2].spell_power / 3 + iVar34;
            if (borg.trait[0x45] == 0) {
              iVar34 = (iVar22 - iVar34) + 0x48;
            }
            else {
              iVar34 = ((iVar22 - iVar34) + 0x4a) / 3;
            }
            iVar29 = 0x28;
            cVar8 = borg.temp.res_fire;
            goto joined_r0x002053e5;
          }
          goto switchD_00203845_caseD_1b;
        case '0':
          if (borg.trait[0x42] == 0) {
            iVar34 = pmVar12[uVar2].spell_power >> 0x1f;
            iVar22 = pmVar12[uVar2].spell_power / 3 + iVar34;
            if (borg.trait[0x46] == 0) {
              iVar34 = (iVar22 - iVar34) + 0x30;
            }
            else {
              iVar34 = ((iVar22 - iVar34) + 0x32) / 3;
            }
            iVar29 = 0x14;
            cVar8 = borg.temp.res_cold;
            goto joined_r0x002053e5;
          }
          goto switchD_00203845_caseD_1b;
        case '1':
          if (borg.trait[0x44] == 0) {
            iVar34 = pmVar12[uVar2].spell_power >> 0x1f;
            iVar22 = pmVar12[uVar2].spell_power / 3 + iVar34;
            if (borg.trait[0x49] == 0) {
              iVar34 = (iVar22 - iVar34) + 0x48;
            }
            else {
              iVar34 = ((iVar22 - iVar34) + 0x4a) / 3;
            }
            iVar29 = 0;
            cVar8 = borg.temp.res_pois;
            goto joined_r0x002053e5;
          }
          goto switchD_00203845_caseD_1b;
        case '2':
          iVar34 = (pmVar12[uVar2].spell_power * 3) / 2 + 0x4b;
          if (borg.trait[0x52] != 0) {
            iVar22 = iVar34 * 6 + 7;
            if (-1 < iVar34 * 6) {
              iVar22 = iVar34 * 6;
            }
            iVar34 = iVar22 >> 3;
            goto LAB_00204c77;
          }
          iVar22 = 200;
          goto LAB_00204f6a;
        case '3':
          iVar34 = pmVar12[uVar2].spell_power + L'd';
          if (borg.trait[0x4f] != 0) goto LAB_00204c77;
          iVar22 = 500;
          if (borg.trait[0x75] == 0) {
            iVar22 = 0;
          }
          iVar29 = iVar22 + 1000;
          if (borg.trait[0x76] == 0) {
            iVar29 = iVar22;
          }
          iVar22 = iVar29;
          if (borg.trait[0x4e] == 0) {
            iVar22 = iVar29 + 0x28;
            if (borg.trait[0x19] != 1) {
              iVar22 = iVar29 + 0x14;
            }
          }
          goto LAB_00204f6a;
        case '4':
          iVar22 = 0x32;
          iVar34 = (pmVar12[uVar2].spell_power * 5) / 2 + 0x32;
          goto LAB_00204f6a;
        case '5':
          iVar34 = pmVar12[uVar2].spell_power + L'B';
          iVar29 = 0;
          iVar22 = 0;
          if (borg.trait[0x4f] == 0) {
            iVar21 = pmVar12[uVar2].spell_power + L'ȶ';
LAB_00204ca8:
            if (borg.trait[0x75] == 0) {
              iVar21 = iVar34;
            }
            iVar22 = iVar29;
            iVar34 = iVar21 + 1000;
            if (borg.trait[0x76] == 0) {
              iVar34 = iVar21;
            }
          }
          goto LAB_00204f6a;
        case '6':
          iVar34 = pmVar12[uVar2].spell_power + L'$';
          iVar29 = 0x14;
          iVar22 = 0x14;
          if (borg.trait[0x4f] == 0) {
            iVar21 = pmVar12[uVar2].spell_power + L'V';
            goto LAB_00204ca8;
          }
          goto LAB_00204f6a;
        case '7':
          iVar34 = pmVar12[uVar2].spell_power / 3 + 0xc;
LAB_00204c77:
          iVar22 = 0;
          goto LAB_00204f6a;
        case '8':
          if (borg.trait[0x43] == 0) {
            if (borg.trait[0x47] == 0) {
              iVar34 = pmVar12[uVar2].spell_power * 2 + 0x37;
            }
            else {
              iVar34 = (pmVar12[uVar2].spell_power * 2 + 0x39) / 3;
            }
            iVar29 = 0;
            goto joined_r0x002053e5;
          }
          goto switchD_00203845_caseD_1b;
        case '9':
          iVar34 = pmVar12[uVar2].spell_power * 2 + 0x37;
          iVar22 = 0;
          if (borg.trait[0x52] != 0) {
            iVar29 = iVar34 * 6 + 7;
            if (-1 < iVar34 * 6) {
              iVar29 = iVar34 * 6;
            }
            iVar34 = iVar29 >> 3;
          }
          goto LAB_00204f6a;
        case ':':
          goto LAB_00204fdf;
        case ';':
          iVar34 = borg.trait[0x4d];
          goto joined_r0x00204f59;
        case '<':
          iVar34 = borg.trait[0x4e];
joined_r0x00204f59:
          if (iVar34 != 0) goto switchD_00203845_caseD_1b;
LAB_00204fdf:
          bVar55 = SBORROW4(borg.trait[0x39],100);
          bVar54 = borg.trait[0x39] + -100 < 0;
          iVar22 = 10;
LAB_00204fed:
          iVar34 = 0;
          if (bVar55 == bVar54) {
            iVar22 = iVar34;
          }
          break;
        case '=':
          if (borg.trait[0x56] != 0) goto switchD_00203845_caseD_1b;
          iVar22 = (uint)(borg.trait[0x39] < 100) * 5;
          goto LAB_00204f61;
        case '>':
          if (borg.trait[0x56] == 0) {
            bVar55 = SBORROW4(borg.trait[0x39],100);
            bVar54 = borg.trait[0x39] + -100 < 0;
            iVar22 = 0x96;
            goto LAB_00204fed;
          }
switchD_00203845_caseD_1b:
          iVar22 = 0;
LAB_00204f61:
          iVar34 = 0;
          break;
        case '?':
        case '@':
        case 'C':
        case 'F':
          iVar22 = 10;
          goto LAB_00204f61;
        case 'D':
        case 'E':
          iVar22 = 0x14;
          goto LAB_00204f61;
        case 'G':
          bVar55 = SBORROW4(borg.trait[0x39],100);
          bVar54 = borg.trait[0x39] + -100 < 0;
          iVar22 = 0x32;
          goto LAB_00204fed;
        case 'I':
          iVar22 = 0x32;
          goto LAB_00204f61;
        case 'J':
          if (99 < borg.trait[0x39]) goto switchD_00203845_caseD_1b;
          iVar22 = 0x1e;
          if (borg.trait[0x1e] < 0xf) {
            iVar22 = 500;
          }
          goto LAB_00204f61;
        case 'K':
          iVar22 = 200;
          goto LAB_00204f61;
        case 'L':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_00203c30;
                }
                iVar43 = 1000;
              }
LAB_00203c30:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          goto LAB_00204a0b;
        case 'M':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_002040fa;
                }
                iVar43 = 1000;
              }
LAB_002040fa:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          goto LAB_00204e5b;
        case 'N':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_0020492d;
                }
                iVar43 = 1000;
              }
LAB_0020492d:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          if (((bVar7 || bVar56) || (borg_create_door != false)) || (borg_fighting_unique != L'\0'))
          goto switchD_00203845_caseD_1b;
          iVar22 = (pmVar12[uVar2].spell_power * 5) / iVar43;
          goto LAB_00204f61;
        case 'O':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_00203cbf;
                }
                iVar43 = 1000;
              }
LAB_00203cbf:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          iVar22 = 0;
          if (((!bVar7 && !bVar56) && (iVar22 = 0, borg_create_door == false)) &&
             (iVar22 = 0, borg_fighting_unique == L'\0')) {
            iVar22 = pmVar12[uVar2].spell_power * 7;
            goto LAB_002050ba;
          }
          goto LAB_002050c0;
        case 'P':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_0020506c;
                }
                iVar43 = 1000;
              }
LAB_0020506c:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          goto LAB_0020507f;
        case 'Q':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_00203b12;
                }
                iVar43 = 1000;
              }
LAB_00203b12:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          goto LAB_0020507f;
        case 'R':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_0020436d;
                }
                iVar43 = 1000;
              }
LAB_0020436d:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
LAB_0020507f:
          iVar22 = 0;
          if (((!bVar7 && !bVar56) && (iVar22 = 0, borg_create_door == false)) &&
             (iVar22 = 0, borg_fighting_unique == L'\0')) {
            iVar22 = pmVar12[uVar2].spell_power * 5;
LAB_002050ba:
            iVar22 = iVar22 / iVar43;
          }
LAB_002050c0:
          _Var13 = flag_has_dbg(r_info->flags,0xb,1,"r_info->flags","RF_UNIQUE");
          iVar34 = 0;
          if (_Var13) {
            iVar22 = (iVar22 * 0x4b) / 100;
          }
          break;
        case 'S':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_00203995;
                }
                iVar43 = 1000;
              }
LAB_00203995:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          if (bVar57) {
            if (bVar7) {
              wVar23 = pmVar12[uVar2].spell_power;
            }
            else {
              wVar23 = pmVar12[uVar2].spell_power;
              if ((borg_create_door == false) && (borg_fighting_unique == L'\0')) {
                wVar23 = wVar23 * 5;
                goto LAB_00204e84;
              }
            }
            wVar23 = wVar23 * 2;
          }
          else {
            wVar23 = pmVar12[uVar2].spell_power;
          }
          goto LAB_00204e84;
        case 'T':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_00203a44;
                }
                iVar43 = 1000;
              }
LAB_00203a44:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          if ((bool)(borg_fighting_unique != L'\0' | bVar56)) goto LAB_00204e7c;
          if (bVar7) goto LAB_00204a21;
          wVar23 = pmVar12[uVar2].spell_power;
          if (borg_create_door != true) goto LAB_00205139;
          goto LAB_00204a29;
        case 'U':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_00203fee;
                }
                iVar43 = 1000;
              }
LAB_00203fee:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          goto LAB_00204a0b;
        case 'V':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_002049f8;
                }
                iVar43 = 1000;
              }
LAB_002049f8:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          goto LAB_00204a0b;
        case 'W':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_00203ba1;
                }
                iVar43 = 1000;
              }
LAB_00203ba1:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
LAB_00204a0b:
          if (bVar57) {
            if (bVar7) {
LAB_00204a21:
              wVar23 = pmVar12[uVar2].spell_power;
            }
            else {
              wVar23 = pmVar12[uVar2].spell_power;
              if ((borg_create_door == false) && (borg_fighting_unique == L'\0')) {
LAB_00205139:
                wVar23 = wVar23 * 7;
                goto LAB_00204e84;
              }
            }
LAB_00204a29:
            wVar23 = wVar23 * 3;
          }
          else {
LAB_00204e7c:
            wVar23 = pmVar12[uVar2].spell_power;
          }
LAB_00204e84:
          iVar22 = wVar23 / iVar43;
          _Var13 = flag_has_dbg(r_info->flags,0xb,1,"r_info->flags","RF_UNIQUE");
          if (_Var13) {
            iVar22 = (iVar22 * 0x4b) / 100;
          }
          goto LAB_00204f61;
        case 'X':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_00203f14;
                }
                iVar43 = 1000;
              }
LAB_00203f14:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          goto LAB_00204e5b;
        case 'Y':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_002038dc;
                }
                iVar43 = 1000;
              }
LAB_002038dc:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          iVar22 = 0;
          if (!bVar57) goto LAB_002050c0;
          if (bVar7) {
            wVar23 = pmVar12[uVar2].spell_power;
LAB_00203914:
            iVar22 = wVar23 * 2;
          }
          else {
            wVar23 = pmVar12[uVar2].spell_power;
            if ((borg_create_door != false) || (borg_fighting_unique != L'\0')) goto LAB_00203914;
            iVar22 = wVar23 << 2;
          }
          iVar22 = iVar22 * 3;
          goto LAB_002050ba;
        case 'Z':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_00204e48;
                }
                iVar43 = 1000;
              }
LAB_00204e48:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
LAB_00204e5b:
          if (!bVar57) goto LAB_00204e7c;
          if (bVar7) {
            wVar23 = pmVar12[uVar2].spell_power;
LAB_00204e75:
            wVar23 = wVar23 * 2;
          }
          else {
            wVar23 = pmVar12[uVar2].spell_power;
            if ((borg_create_door != false) || (borg_fighting_unique != L'\0')) goto LAB_00204e75;
            wVar23 = wVar23 << 2;
          }
LAB_00204e77:
          wVar23 = wVar23 * 3;
          goto LAB_00204e84;
        case '[':
          iVar34 = -1;
          do {
            lVar42 = -1;
            do {
              if (((int)lVar42 != 0 || iVar34 != 0) &&
                 (_Var13 = borg_feature_protected
                                     (borg_grids[(pbVar50->pos).y + lVar42] +
                                      (long)iVar34 + (long)(pbVar50->pos).x), _Var13)) {
                if (borg_morgoth_position == false) {
                  bVar54 = iVar43 == -1;
                  iVar22 = iVar43 + 1;
                  bVar55 = iVar43 != 7;
                  iVar43 = 100;
                  if (bVar55) {
                    iVar43 = iVar22 + (uint)bVar54;
                  }
                  if (borg_as_position != true) goto LAB_002042c0;
                }
                iVar43 = 1000;
              }
LAB_002042c0:
              lVar42 = lVar42 + 1;
            } while ((int)lVar42 != 2);
            iVar34 = iVar34 + 1;
          } while (iVar34 != 2);
          if (!bVar57) goto LAB_00204e7c;
          if (!bVar7) {
            wVar23 = pmVar12[uVar2].spell_power;
            if (borg_create_door == true) goto LAB_00204e77;
            goto LAB_00204e75;
          }
          wVar23 = pmVar12[uVar2].spell_power;
          goto LAB_00204e77;
        }
        if (bVar26) {
LAB_00204f6a:
          _Var13 = borg_projectable_pure((pbVar50->pos).y,(pbVar50->pos).x,borg.c.y,borg.c.x);
          if (!_Var13) {
            iVar34 = 0;
          }
          bVar26 = true;
        }
        else {
          bVar26 = false;
        }
        if (0x4a < borg.trait[0x6a]) {
          iVar22 = 0;
        }
        uVar47 = iVar22 + iVar34;
        if ((int)uVar15 < (int)uVar47) {
          uVar15 = uVar47;
        }
        iVar38 = iVar38 + uVar47;
        uVar52 = uVar52 + 1;
      } while (uVar52 < pbVar50->ranged_attack);
      uVar47 = 0;
      if (0 < iVar38 - borg.trait[0x2f]) {
        uVar47 = iVar38 - borg.trait[0x2f];
      }
      uVar52 = (ulong)uVar47;
      if ((borg_morgoth_position != false) || (borg_as_position == true)) {
        uVar52 = (ulong)(uVar47 * 7) / 10;
      }
      uVar46 = (uint)(uVar52 / pbVar50->ranged_attack);
      uVar47 = uVar46;
      if (((average) && (uVar47 = uVar15, (int)uVar15 < (int)((uVar46 * 0xf) / 10))) &&
         (uVar47 = uVar46, (borg.trait[0x1b] << 3) / 10 < (int)uVar15)) {
        uVar47 = uVar15;
      }
    }
  }
  if ((pmVar11[uVar32].freq_innate == L'\0') && (pmVar11[uVar32].freq_spell == L'\0')) {
    uVar47 = 0;
  }
  wVar23 = borg_distance(y_00,wVar24,y,x);
  local_114 = 0;
  if (wVar23 <= (int)(uint)z_info->max_range) {
    local_114 = uVar47;
  }
  if ((((int)uVar28 < 0xb) && (_Var13 = borg_projectable(y_00,wVar24,y,x), !_Var13)) &&
     (_Var13 = borg_projectable(y,x,y_00,wVar24), !_Var13)) {
    local_114 = 0;
  }
  if (0x13 < (int)uVar16) {
    uVar28 = (int)(local_114 * uVar16) / 10;
    lVar42 = 0;
    local_114 = 0;
    do {
      pcVar10 = cave;
      lVar37 = (long)ddy_ddd[lVar42] + (long)y_00;
      lVar51 = (long)ddx_ddd[lVar42] + (long)wVar24;
      wVar48 = (wchar_t)lVar51;
      wVar23 = (wchar_t)lVar37;
      lVar25 = (loc)loc(wVar48,wVar23);
      _Var13 = square_in_bounds_fully(pcVar10,lVar25);
      if ((((_Var13) && (borg_grids[lVar37][lVar51].kill == '\0')) &&
          (bVar1 = borg_grids[lVar37][lVar51].feat, bVar1 != 2)) && (bVar1 != 0x16)) {
        if (0xf < bVar1) {
          _Var13 = flag_has_dbg(flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
          if ((_Var13) && (_Var13 = borg_projectable(wVar23,wVar48,y,x), _Var13)) {
            local_114 = uVar28;
          }
          _Var13 = flag_has_dbg(flags,0xb,0x2f,"r_ptr->flags","RF_KILL_WALL");
          if (!_Var13) goto LAB_00205736;
        }
        _Var13 = borg_projectable(wVar23,wVar48,y,x);
        if (_Var13) {
          local_114 = uVar28;
        }
      }
LAB_00205736:
      lVar42 = lVar42 + 1;
    } while (lVar42 != 8);
    uVar16 = 0x14;
  }
  uVar28 = local_114;
  if (25000 < borg_t) {
    uVar28 = (int)local_114 / 5;
  }
  if (0x4b0 < borg.time_this_panel) {
    uVar28 = (int)local_114 / 5;
  }
  uVar52 = (ulong)uVar28;
  _Var13 = flag_has_dbg(flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
  if ((_Var13) && (borg.trait[0x23] < 0x14)) {
    uVar52 = (ulong)((int)(uVar28 * 0xc) / 10 + uVar28);
  }
  if (((pmVar11[uVar32].friends != (monster_friends *)0x0) ||
      (pmVar11[uVar32].friends_base != (monster_friends_base *)0x0)) && (borg.trait[0x23] < 0x14)) {
    uVar52 = (ulong)(uint)(((int)uVar52 * 0xc) / 10 + (int)uVar52);
  }
  iVar17 = (int)uVar52;
  if (pbVar49->awake == true) {
    if ((((borg_sleep_spell_ii & bVar53) != 0) &&
        (_Var13 = flag_has_dbg(flags,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP"), !_Var13)) &&
       (_Var13 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13)) {
      iVar30 = borg.trait[0x23];
      iVar44 = (iVar30 - 10U >> 2) * 3 + 10;
      if (iVar30 < 0xf) {
        iVar44 = iVar30;
      }
      if (pbVar49->level <= iVar44) {
        uVar52 = (ulong)(uint)(iVar17 / 3);
      }
    }
  }
  else {
    iVar30 = (int)(uVar52 >> 0x1f) + iVar17 >> 1;
    if (borg.trait[0x23] < 0x19) {
      iVar30 = iVar17;
    }
    uVar52 = (ulong)(uint)(((pmVar11[uVar32].sleep + L'\x05') * iVar30) / 100 + iVar30);
  }
  if ((borg_crush_spell == true) &&
     (((int)pbVar49->injury * (int)pbVar49->power) / 100 < borg.trait[0x23] * 4)) {
    uVar52 = 0;
  }
  if (borg_sleep_spell == true) {
    uVar52 = (long)(int)uVar52 / (long)(iVar27 + 2) & 0xffffffff;
  }
  iVar27 = (int)(uVar52 >> 0x1f) + (int)uVar52 >> 1;
  if (pbVar49->confused == false) {
    iVar27 = (int)uVar52;
  }
  if (pbVar49->stunned == true) {
    iVar27 = (iVar27 * 10) / 0xd;
  }
  if (borg_confuse_spell != false) {
    iVar27 = iVar27 / 6;
  }
  if (!full_damage) {
    uVar28 = pmVar11[uVar32].freq_spell + pmVar11[uVar32].freq_innate;
    if ((int)uVar28 < 0x16) {
      iVar27 = iVar27 << 2;
    }
    else if (uVar28 < 0x34) {
      iVar27 = iVar27 * 6;
    }
    else {
      if (0x65 < uVar28) goto LAB_00205a60;
      iVar27 = iVar27 << 3;
    }
    iVar27 = iVar27 / 10;
  }
LAB_00205a60:
  if (iVar27 == 0) {
    wVar24 = L'\0';
  }
  else {
    wVar24 = (int)(iVar27 * uVar16) / 10;
  }
  if (wVar24 < wVar18) {
    wVar24 = wVar18;
  }
  if (L'ߏ' < wVar24) {
    wVar24 = L'ߐ';
  }
  return wVar24;
}

Assistant:

int borg_danger_one_kill(
    int y, int x, int c, int i, bool average, bool full_damage)
{
    borg_kill *kill            = &borg_kills[i];

    struct monster_race *r_ptr = &r_info[kill->r_idx];

    int x9                     = kill->pos.x;
    int y9                     = kill->pos.y;
    int y_temp, x_temp;

    int ax, ay, d;

    int q = 0, r, p, v1 = 0, v2 = 0, b_v2 = 0, b_v1 = 0;

    int fake_speed    = borg.trait[BI_SPEED];
    int monster_speed = kill->speed;
    int t, e;

    int ii;
    int chance;

    /* Paranoia */
    if (!kill->r_idx)
        return 0;

    /* "player ghosts" */
    if (kill->r_idx >= z_info->r_max - 1)
        return 100;

    /* Skip certain monster indexes.
     * These have been listed mainly in Teleport Other
     * checks in borg6.c in the defense maneuvers.
     */
    if (borg_tp_other_n) {
        for (ii = 0; ii <= borg_tp_other_n; ii++) {
            /* Is the current danger check same as a saved monster index? */
            if (i == borg_tp_other_index[ii]) {
                return 0;
            }
        }
    }

    /* Distance components */
    ax = (x9 > x) ? (x9 - x) : (x - x9);
    ay = (y9 > y) ? (y9 - y) : (y - y9);

    /* Distance */
    d = MAX(ax, ay);

    /* Minimal distance */
    if (d < 1)
        d = 1;

    /* Minimal distance */
    if (d > 20)
        return 0;

    /* A very speedy borg will miscalculate danger of some monsters */
    if (borg.trait[BI_SPEED] >= 135)
        fake_speed = (borg_fighting_unique ? 120 : 125);

    /* Consider the character haste and slow monster spells */
    if (borg.temp.fast)
        fake_speed += 10;
    if (borg_slow_spell)
        monster_speed -= 10;

    /* Assume monsters are a little fast when you are low level */
    if (borg.trait[BI_MAXHP] < 20 && borg.trait[BI_CDEPTH])
        monster_speed += 3;

    /* Player energy per game turn  */
    e = extract_energy[(fake_speed)];

    /* Game turns per player move  */
    t = (100 + (e - 1)) / e;

    /*  Monster energy per game turn  */
    e = extract_energy[monster_speed];

    /* Monster moves */
    q = c * ((t * e) / 10);

    /* allow partial hits when not calculating full possible damage */
    if (full_damage)
        q = (int)((q + 9) / 10) * 10;

    /* Minimal energy.  Monsters get at least some energy.
     * If the borg is very fast relative to a monster, then the
     * monster danger is artificially low due to the way the borg
     * will calculate the danger and energy.  So the monsters must
     * be given some base energy to equate the borg's.
     * ie:  the borg with speed +40 (speed = 150) is attacking
     * a monster with normal speed (speed = 110).  One would
     * think that the borg gets 4 attacks per turn over the monster.
     * and this does happen.  What if the monster can deal out
     * 1000 damage pts per monster attack turn?  The borg will
     * reduce the danger to 250 because the borg is 4x faster
     * than the monster.  But eventually the borg will get hit
     * by that 1000 pt damage attack.  And when it does, its
     * going to hurt.
     * So we make sure the monster is at least as fast as us.
     * But the monster is allowed to be faster than us.
     */
    if (q <= 10)
        q = 10;

    /** Danger from physical attacks **/

    /* Physical attacks */
    v1 = borg_danger_physical(i, full_damage);

    /* Hack -- Under Stressful Situation.
     */
    if (borg.time_this_panel > 1200 || borg_t > 25000) {
        /* he might be stuck and could overflow */
        v1 = v1 / 5;
    }

    /* No attacks for some monsters */
    if (rf_has(r_ptr->flags, RF_NEVER_BLOW)) {
        v1 = 0;
    }

    /* No movement for some monsters */
    if ((rf_has(r_ptr->flags, RF_NEVER_MOVE)) && (d > 1)) {
        v1 = 0;
    }

    /* multipliers yeild some trouble when I am weak */
    if ((rf_has(r_ptr->flags, RF_MULTIPLY))
        && (borg.trait[BI_CLEVEL] < 20)) { /* extra 50% */
        v1 = v1 + (v1 * 15 / 10);
    }

    /* Friends yeild some trouble when I am weak */
    if ((r_ptr->friends || r_ptr->friends_base)
        && (borg.trait[BI_CLEVEL] < 20)) {
        if (borg.trait[BI_CLEVEL] < 15) {
            /* extra 80% */
            v1 = v1 + (v1 * 18 / 10);
        } else {
            /* extra 30% */
            v1 = v1 + (v1 * 13 / 10);
        }
    }

    /* Reduce danger from sleeping monsters */
    if (!kill->awake) {
        int inc = r_ptr->sleep + 5;
        /* Reduce the fear if Borg is higher level */
        if (borg.trait[BI_CLEVEL] >= 25) {
            v1 = v1 / 2;
        }

        /* Tweak danger based on the "alertness" of the monster */
        /* increase the danger for light sleepers */
        v1 = v1 + (v1 * inc / 100);
    }
    /* Reduce danger from sleeping monsters with the sleep 2 spell*/
    if (borg_sleep_spell_ii) {
        if ((d == 1) && (kill->awake) && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / 3;
            }
        }
    }
    /* Reduce danger from sleeping monsters with the sleep 1,3 spell*/
    if (borg_sleep_spell) {
        if (kill->awake && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / (d + 2);
            }
        }
    }
    if (borg_crush_spell) {
        /* HACK for now, either it dies or it doesn't.  */
        /* If we discover it isn't using this spell much, we can modify */
        if ((kill->power * kill->injury) / 100 < borg.trait[BI_CLEVEL] * 4)
            v1 = 0;
    }

    /* Reduce danger from confused monsters */
    if (kill->confused) {
        v1 = v1 / 2;
    }
    if (kill->stunned) {
        v1 = v1 * 10 / 13;
    }
    if (borg_confuse_spell) {
        if (kill->awake && !kill->confused
            && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level <= (borg.trait[BI_CLEVEL] - 15))) {
            /* Under special circumstances force the damage to 0 */
            if (borg.trait[BI_CLEVEL] < 20
                && borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
                v1 = 0;
            } else {
                v1 = v1 / (d + 2);
            }
        }
    }
    /* Perceive a reduce danger from scared monsters */
    if (borg_fear_mon_spell) {
        v1 = 0;
    }

    /* Hack -- Physical attacks require proximity
     *
     * Note that we do try to consider a fast monster moving and attacking
     * in the same round.  We should consider monsters that have a speed 2 or 3
     * classes higher than ours, but most times, the borg will only encounter
     * monsters with a single category higher speed.
     */
    if (q > 10 && d != 1 && !(rf_has(r_ptr->flags, RF_NEVER_MOVE))) {
        b_v1 = 0;

        /* Check for a single grid movement, simulating the monster's move
         * action. */
        for (ii = 0; ii < 8; ii++) {
            /* Obtain a grid to which the monster might move */
            y_temp = y9 + ddy_ddd[ii];
            x_temp = x9 + ddx_ddd[ii];

            /* Check for legality */
            if (!square_in_bounds_fully(cave, loc(x_temp, y_temp)))
                continue;

            /* Cannot occupy another monster's grid */
            if (borg_grids[y_temp][x_temp].kill)
                continue;

            /* Cannot occupy a closed door */
            if (borg_grids[y_temp][x_temp].feat == FEAT_CLOSED)
                continue;

            /* Cannot occupy a perma-wall */
            if (borg_grids[y_temp][x_temp].feat == FEAT_PERM)
                continue;

            /* Cannot occupy a wall/seam grid (unless pass_wall or kill_wall) */
            if (borg_grids[y_temp][x_temp].feat == FEAT_GRANITE
                || (borg_grids[y_temp][x_temp].feat == FEAT_MAGMA
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ
                    || borg_grids[y_temp][x_temp].feat == FEAT_MAGMA_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_RUBBLE)) {
                /* legally on a wall of some sort, check for closeness*/
                if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
                    if (borg_distance(y_temp, x_temp, y, x) == 1)
                        b_v1 = v1;
                }
                if (rf_has(r_ptr->flags, RF_KILL_WALL)) {
                    if (borg_distance(y_temp, x_temp, y, x) == 1)
                        b_v1 = v1;
                }
            }

            /* Is this grid being considered adjacent to the grid for which the
             * borg_danger() was called? */
            if (borg_distance(y_temp, x_temp, y, x) > 1)
                continue;

            /* A legal floor grid */
            if (borg_cave_floor_bold(y_temp, x_temp)) {
                /* Really fast monster can hit me more than once after it's move
                 */
                b_v1 = v1 * (q / (d * 10));
            }
        }

        /* Monster is not able to move and threaten me in the same round */
        v1 = b_v1;
    }

    /* Consider a monster that is fast and can strike more than once per round
     */
    if (q > 10 && d == 1) {
        v1 = v1 * q / 10;
    }

    /* Need to be close if you are normal speed */
    if (q == 10 && d > 1) {
        v1 = 0;
    }

    /** Ranged Attacks **/
    v2 = borg_danger_spell(i, y, x, d, average, full_damage);

    /* Never cast spells */
    if (!r_ptr->freq_innate && !r_ptr->freq_spell) {
        v2 = 0;
    }

    /* Hack -- verify distance */
    if (borg_distance(y9, x9, y, x) > z_info->max_range) {
        v2 = 0;
    }

    /* Hack -- verify line of sight (both ways) for monsters who can only move 1
     * grid. */
    if (q <= 10 && !borg_projectable(y9, x9, y, x)
        && !borg_projectable(y, x, y9, x9)) {
        v2 = 0;
    }

    /* Hack -- verify line of sight (both ways) for monsters who can only move >
     *1 grid. Some fast monsters can take a move action and range attack in the
     *same round. Basically, we see how many grids the monster can move and
     *check LOS from each of those grids to determine the relative danger.  We
     *need to make sure that the monster is not passing through walls unless he
     *has that ability. Consider a fast monster who can move and cast a spell in
     *the same round. This is important for a borg looking for a safe grid from
     *a ranged attacker. If the attacker is fast then he might be able to move
     *to a grid which does have LOS to the grid the borg is considering.
     *
     * ##############
     * #.....#.#.1#D#   Grids marked 2 are threatened by the D currently.
     * #####.#..##@##	Grids marked 1 are safe currently, but the fast D will
     *be able
     * #####.#..1221#	to move to the borg's grid after he moves and the D will
     *be able
     * ##############	to use a ranged attack to grids 1, all in the same
     *round. The borg should not consider grid 1 as safe.
     */
    if (q >= 20) {
        int b_q = q;
        b_v2    = 0;

        /* Maximal speed check */
        if (q > 20)
            q = 20;

        /* Check for a single grid movement, simulating the monster's move
         * action. */
        for (ii = 0; ii < 8; ii++) {
            /* Obtain a grid to which the monster might move */
            y_temp = y9 + ddy_ddd[ii];
            x_temp = x9 + ddx_ddd[ii];

            /* Check for legality */
            if (!square_in_bounds_fully(cave, loc(x_temp, y_temp)))
                continue;

            /* Cannot occupy another monster's grid */
            if (borg_grids[y_temp][x_temp].kill)
                continue;

            /* Cannot occupy a closed door */
            if (borg_grids[y_temp][x_temp].feat == FEAT_CLOSED)
                continue;

            /* Cannot occupy a perma-wall */
            if (borg_grids[y_temp][x_temp].feat == FEAT_PERM)
                continue;

            /* Cannot occupy a wall/seam grid (unless pass_wall or kill_wall) */
            if (borg_grids[y_temp][x_temp].feat >= FEAT_GRANITE
                || (borg_grids[y_temp][x_temp].feat == FEAT_MAGMA
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ
                    || borg_grids[y_temp][x_temp].feat == FEAT_MAGMA_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_QUARTZ_K
                    || borg_grids[y_temp][x_temp].feat == FEAT_RUBBLE)) {
                /* legally on a wall of some sort, check for LOS*/
                if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
                    if (borg_projectable(y_temp, x_temp, y, x))
                        b_v2 = v2 * b_q / 10;
                }
                if (rf_has(r_ptr->flags, RF_KILL_WALL)) {
                    if (borg_projectable(y_temp, x_temp, y, x))
                        b_v2 = v2 * b_q / 10;
                }
            }

            /* Monster on a legal floor grid.  Can he see me? */
            else if (borg_projectable(y_temp, x_temp, y, x))
                b_v2 = v2 * b_q / 10;
        }

        /* Monster is not able to move and threaten me in the same round */
        v2 = b_v2;
    }

    /* Hack -- Under Stressful Situation.
     */
    if (borg.time_this_panel > 1200 || borg_t > 25000) {
        /* he might be stuck and could overflow */
        v2 = v2 / 5;
    }

    /* multipliers yield some trouble when I am weak */
    if ((rf_has(r_ptr->flags, RF_MULTIPLY)) && (borg.trait[BI_CLEVEL] < 20)) {
        v2 = v2 + (v2 * 12 / 10);
    }

    /* Friends yield some trouble when I am weak */
    if ((r_ptr->friends || r_ptr->friends_base)
        && (borg.trait[BI_CLEVEL] < 20)) {
        v2 = v2 + (v2 * 12 / 10);
    }

    /* Reduce danger from sleeping monsters */
    if (!kill->awake) {
        int inc = r_ptr->sleep + 5;
        /* weaklings and should still fear */
        if (borg.trait[BI_CLEVEL] >= 25) {
            v2 = v2 / 2;
        }

        /* Tweak danger based on the "alertness" of the monster */
        /* increase the danger for light sleepers */
        v2 = v2 + (v2 * inc / 100);
    }

    /* Reduce danger from sleeping monsters with the sleep 2 spell*/
    if (borg_sleep_spell_ii) {

        if ((d == 1) && (kill->awake) && (!(rf_has(r_ptr->flags, RF_NO_SLEEP)))
            && (!(rf_has(r_ptr->flags, RF_UNIQUE)))
            && (kill->level
                <= ((borg.trait[BI_CLEVEL] < 15)
                        ? borg.trait[BI_CLEVEL]
                        : (((borg.trait[BI_CLEVEL] - 10) / 4) * 3) + 10))) {
            v2 = v2 / 3;
        }
    }

    if (borg_crush_spell) {
        /* HACK for now, either it dies or it doesn't.  */
        /* If we discover it isn't using this spell much, we can modify */
        if ((kill->power * kill->injury) / 100 < borg.trait[BI_CLEVEL] * 4)
            v2 = 0;
    }

    /* Reduce danger from sleeping monsters with the sleep 1,3 spell*/
    if (borg_sleep_spell) {
        v2 = v2 / (d + 2);
    }
    /* Reduce danger from confused monsters */
    if (kill->confused) {
        v2 = v2 / 2;
    }
    /* Reduce danger from stunned monsters  */
    if (kill->stunned) {
        v2 = v2 * 10 / 13;
    }
    if (borg_confuse_spell) {
        v2 = v2 / 6;
    }

#if 0 /* They still cast spells, they are still dangerous */
    /* Reduce danger from scared monsters */
    if (borg_fear_mon_spell) {
        v2 = v2 * 8 / 10;
    }
    if (kill->afraid) {
        v2 = v2 * 8 / 10;
    }
#endif
    if (!full_damage) {
        /* reduce for frequency. */
        chance = (r_ptr->freq_innate + r_ptr->freq_spell) / 2;
        if (chance < 11)
            v2 = ((v2 * 4) / 10);
        else if (chance < 26)
            v2 = ((v2 * 6) / 10);
        else if (chance < 51)
            v2 = ((v2 * 8) / 10);
    }

    /* Danger */
    if (v2) {
        /* Full power */
        r = q;

        /* Total danger */
        v2 = v2 * r / 10;
    }

    /* Maximal danger */
    p = MAX(v1, v2);
    if (p > 2000)
        p = 2000;

    /* Result */
    return (p);
}